

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::TimeZoneFormat::formatOffsetLocalizedGMT
          (TimeZoneFormat *this,int32_t offset,UBool isShort,UnicodeString *result,
          UErrorCode *status)

{
  int iVar1;
  UErrorCode *this_00;
  UBool UVar2;
  uint8_t minDigits;
  int32_t iVar3;
  UChar *p;
  bool bVar4;
  ConstChar16Ptr local_68;
  FieldType local_5c;
  GMTOffsetField *pGStack_58;
  FieldType type;
  GMTOffsetField *item;
  UVector *pUStack_48;
  int32_t i;
  UVector *offsetPatternItems;
  int32_t offsetS;
  int32_t offsetM;
  int32_t offsetH;
  UBool positive;
  UErrorCode *status_local;
  UnicodeString *result_local;
  UBool isShort_local;
  TimeZoneFormat *pTStack_18;
  int32_t offset_local;
  TimeZoneFormat *this_local;
  
  _offsetH = status;
  status_local = (UErrorCode *)result;
  result_local._3_1_ = isShort;
  result_local._4_4_ = offset;
  pTStack_18 = this;
  UVar2 = ::U_FAILURE(*status);
  if (UVar2 == '\0') {
    if ((-MAX_OFFSET < result_local._4_4_) && (result_local._4_4_ < MAX_OFFSET)) {
      if (result_local._4_4_ == 0) {
        UnicodeString::setTo((UnicodeString *)status_local,&this->fGMTZeroFormat);
        this_local = (TimeZoneFormat *)status_local;
      }
      else {
        bVar4 = result_local._4_4_ < 0;
        if (bVar4) {
          result_local._4_4_ = -result_local._4_4_;
        }
        offsetM._3_1_ = !bVar4;
        offsetS = result_local._4_4_ / 3600000;
        offsetPatternItems._4_4_ = (result_local._4_4_ % 3600000) / 60000;
        result_local._4_4_ = (result_local._4_4_ % 3600000) % 60000;
        offsetPatternItems._0_4_ = result_local._4_4_ / 1000;
        if ((bool)offsetM._3_1_) {
          if ((int)offsetPatternItems == 0) {
            if ((offsetPatternItems._4_4_ == 0) && (result_local._3_1_ != '\0')) {
              pUStack_48 = this->fGMTOffsetPatternItems[4];
            }
            else {
              pUStack_48 = this->fGMTOffsetPatternItems[0];
            }
          }
          else {
            pUStack_48 = this->fGMTOffsetPatternItems[1];
          }
        }
        else if ((int)offsetPatternItems == 0) {
          if ((offsetPatternItems._4_4_ == 0) && (result_local._3_1_ != '\0')) {
            pUStack_48 = this->fGMTOffsetPatternItems[5];
          }
          else {
            pUStack_48 = this->fGMTOffsetPatternItems[2];
          }
        }
        else {
          pUStack_48 = this->fGMTOffsetPatternItems[3];
        }
        UnicodeString::setTo((UnicodeString *)status_local,&this->fGMTPatternPrefix);
        for (item._4_4_ = 0; iVar1 = item._4_4_, iVar3 = UVector::size(pUStack_48), iVar1 < iVar3;
            item._4_4_ = item._4_4_ + 1) {
          pGStack_58 = (GMTOffsetField *)UVector::elementAt(pUStack_48,item._4_4_);
          local_5c = GMTOffsetField::getType(pGStack_58);
          this_00 = status_local;
          switch(local_5c) {
          case TEXT:
            p = GMTOffsetField::getPatternText(pGStack_58);
            ConstChar16Ptr::ConstChar16Ptr(&local_68,p);
            UnicodeString::append((UnicodeString *)this_00,&local_68,-1);
            ConstChar16Ptr::~ConstChar16Ptr(&local_68);
            break;
          case HOUR:
            minDigits = '\x02';
            if (result_local._3_1_ != '\0') {
              minDigits = '\x01';
            }
            appendOffsetDigits(this,(UnicodeString *)status_local,offsetS,minDigits);
            break;
          case MINUTE:
            appendOffsetDigits(this,(UnicodeString *)status_local,offsetPatternItems._4_4_,'\x02');
            break;
          case SECOND:
            appendOffsetDigits(this,(UnicodeString *)status_local,(int)offsetPatternItems,'\x02');
          }
        }
        UnicodeString::append((UnicodeString *)status_local,&this->fGMTPatternSuffix);
        this_local = (TimeZoneFormat *)status_local;
      }
    }
    else {
      UnicodeString::setToBogus((UnicodeString *)status_local);
      *_offsetH = U_ILLEGAL_ARGUMENT_ERROR;
      this_local = (TimeZoneFormat *)status_local;
    }
  }
  else {
    UnicodeString::setToBogus((UnicodeString *)status_local);
    this_local = (TimeZoneFormat *)status_local;
  }
  return (UnicodeString *)this_local;
}

Assistant:

UnicodeString&
TimeZoneFormat::formatOffsetLocalizedGMT(int32_t offset, UBool isShort, UnicodeString& result, UErrorCode& status) const {
    if (U_FAILURE(status)) {
        result.setToBogus();
        return result;
    }
    if (offset <= -MAX_OFFSET || offset >= MAX_OFFSET) {
        result.setToBogus();
        status = U_ILLEGAL_ARGUMENT_ERROR;
        return result;
    }

    if (offset == 0) {
        result.setTo(fGMTZeroFormat);
        return result;
    }

    UBool positive = TRUE;
    if (offset < 0) {
        offset = -offset;
        positive = FALSE;
    }

    int32_t offsetH = offset / MILLIS_PER_HOUR;
    offset = offset % MILLIS_PER_HOUR;
    int32_t offsetM = offset / MILLIS_PER_MINUTE;
    offset = offset % MILLIS_PER_MINUTE;
    int32_t offsetS = offset / MILLIS_PER_SECOND;

    U_ASSERT(offsetH <= MAX_OFFSET_HOUR && offsetM <= MAX_OFFSET_MINUTE && offsetS <= MAX_OFFSET_SECOND);

    const UVector* offsetPatternItems = NULL;
    if (positive) {
        if (offsetS != 0) {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_POSITIVE_HMS];
        } else if (offsetM != 0 || !isShort) {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_POSITIVE_HM];
        } else {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_POSITIVE_H];
        }
    } else {
        if (offsetS != 0) {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_NEGATIVE_HMS];
        } else if (offsetM != 0 || !isShort) {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_NEGATIVE_HM];
        } else {
            offsetPatternItems = fGMTOffsetPatternItems[UTZFMT_PAT_NEGATIVE_H];
        }
    }

    U_ASSERT(offsetPatternItems != NULL);

    // Building the GMT format string
    result.setTo(fGMTPatternPrefix);

    for (int32_t i = 0; i < offsetPatternItems->size(); i++) {
        const GMTOffsetField* item = (GMTOffsetField*)offsetPatternItems->elementAt(i);
        GMTOffsetField::FieldType type = item->getType();

        switch (type) {
        case GMTOffsetField::TEXT:
            result.append(item->getPatternText(), -1);
            break;

        case GMTOffsetField::HOUR:
            appendOffsetDigits(result, offsetH, (isShort ? 1 : 2));
            break;

        case GMTOffsetField::MINUTE:
            appendOffsetDigits(result, offsetM, 2);
            break;

        case GMTOffsetField::SECOND:
            appendOffsetDigits(result, offsetS, 2);
            break;
        }
    }

    result.append(fGMTPatternSuffix);
    return result;
}